

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_general.h
# Opt level: O2

void mp::WriteJSON<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>>
               (JSONW *jw,
               IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>
               *ic)

{
  string_view key;
  string_view key_00;
  string_view key_01;
  int local_44;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_40;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_30;
  
  local_44 = ic->b_;
  key._M_str = (char *)0x7;
  key._M_len = (size_t)jw;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[](&local_40,key);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)&local_40,
             &local_44);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter(&local_40);
  local_44 = ic->bv_;
  key_00._M_str = (char *)0x7;
  key_00._M_len = (size_t)jw;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[](&local_40,key_00)
  ;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)&local_40,
             &local_44);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter(&local_40);
  key_01._M_str = (char *)0x3;
  key_01._M_len = (size_t)jw;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[](&local_30,key_01)
  ;
  WriteJSON<mp::QuadAndLinTerms,mp::AlgConRhs<1>>(&local_30,&ic->con_);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter(&local_30);
  return;
}

Assistant:

inline void WriteJSON(JSONW jw,
                      const IndicatorConstraint<Con>& ic) {
  jw["bin_var"] = ic.get_binary_var();
  jw["bin_val"] = ic.get_binary_value();
  WriteJSON(jw["con"], ic.get_constraint());
}